

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void amrex::Sleep(double sleepsec)

{
  duration<double,_std::ratio<1L,_1L>_> local_8;
  
  local_8.__r = sleepsec;
  std::this_thread::sleep_for<double,std::ratio<1l,1l>>(&local_8);
  return;
}

Assistant:

void amrex::Sleep(double sleepsec) {
    std::this_thread::sleep_for(std::chrono::duration<double>(sleepsec));
}